

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_MockParameterTest_expectMultipleCallsWithParameters_TestShell::createTest
          (TEST_MockParameterTest_expectMultipleCallsWithParameters_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x38b);
  this_00->_vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_002dad10;
  return this_00;
}

Assistant:

TEST(MockParameterTest, expectMultipleCallsWithParameters)
{
    int expected_int = -7;
    unsigned int expected_uint = 7;

    mock().expectNCalls(2, "boo").withParameter("double", 1.0).withParameter("int", expected_int).
        withParameter("string", "string").withParameter("uint", expected_uint);
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", expected_int).withParameter("string", "string").
        withParameter("uint", expected_uint);
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", expected_int).withParameter("string", "string").
        withParameter("uint", expected_uint);

    mock().checkExpectations();
}